

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O2

string * __thiscall
flatbuffers::ts::TsGenerator::GenTypeName
          (string *__return_storage_ptr__,TsGenerator *this,import_set *imports,Definition *owner,
          Type *type,bool input,bool allowNull)

{
  BaseType BVar1;
  char *pcVar2;
  char *pcVar3;
  string *this_00;
  undefined3 in_register_00000089;
  string name;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string name_1;
  
  BVar1 = type->base_type;
  if (CONCAT31(in_register_00000089,input) == 0) {
    switch(BVar1) {
    case BASE_TYPE_LONG:
    case BASE_TYPE_ULONG:
      goto switchD_001c984c_caseD_9;
    case BASE_TYPE_FLOAT:
    case BASE_TYPE_DOUBLE:
    case BASE_TYPE_VECTOR:
    case BASE_TYPE_UNION:
      goto switchD_001c984c_caseD_b;
    case BASE_TYPE_STRING:
    case BASE_TYPE_STRUCT:
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = name.field_2._M_allocated_capacity & 0xffffffffffffff00;
      if (BVar1 == BASE_TYPE_STRING) {
        std::__cxx11::string::assign((char *)&name);
      }
      else {
        AddImport<flatbuffers::StructDef>
                  ((ImportDefinition *)&name_1,this,imports,owner,type->struct_def);
        std::__cxx11::string::operator=((string *)&name,(string *)&name_1);
        anon_unknown_10::ImportDefinition::~ImportDefinition((ImportDefinition *)&name_1);
      }
      if (allowNull) {
        std::operator+(__return_storage_ptr__,&name,"|null");
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&name);
      }
      goto LAB_001c9ad8;
    case BASE_TYPE_ARRAY:
      goto switchD_001c984c_caseD_11;
    }
switchD_001c984c_default:
    if (BVar1 == BASE_TYPE_BOOL) {
      pcVar2 = "boolean|null";
      pcVar3 = "boolean";
      goto LAB_001c9871;
    }
switchD_001c984c_caseD_b:
    if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
      if (type->enum_def != (EnumDef *)0x0) {
        AddImport<flatbuffers::EnumDef>
                  ((ImportDefinition *)&name_1,this,imports,owner,type->enum_def);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name_1._M_dataplus._M_p == &name_1.field_2) {
          name.field_2._8_8_ = name_1.field_2._8_8_;
        }
        else {
          name._M_dataplus = name_1._M_dataplus;
        }
        name.field_2._M_allocated_capacity._1_7_ = name_1.field_2._M_allocated_capacity._1_7_;
        name.field_2._M_local_buf[0] = name_1.field_2._M_local_buf[0];
        name._M_string_length = name_1._M_string_length;
        name_1._M_string_length = 0;
        name_1.field_2._M_local_buf[0] = '\0';
        name_1._M_dataplus._M_p = (pointer)&name_1.field_2;
        anon_unknown_10::ImportDefinition::~ImportDefinition((ImportDefinition *)&name_1);
        if (allowNull) {
          std::operator+(__return_storage_ptr__,&name,"|null");
        }
        else {
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&name);
        }
LAB_001c9ad8:
        this_00 = &name;
        goto LAB_001c9add;
      }
      pcVar2 = "number|null";
      pcVar3 = "number";
LAB_001c9871:
      if (allowNull) {
        pcVar3 = pcVar2;
      }
    }
    else {
      pcVar3 = "flatbuffers.Offset";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar3,(allocator<char> *)&name_1);
  }
  else {
    if (BVar1 - BASE_TYPE_LONG < 2) {
switchD_001c984c_caseD_9:
      pcVar2 = "bigint|null";
      pcVar3 = "bigint";
      goto LAB_001c9871;
    }
    if (BVar1 != BASE_TYPE_ARRAY) goto switchD_001c984c_default;
switchD_001c984c_caseD_11:
    name_1._M_dataplus._M_p = (pointer)&name_1.field_2;
    name_1._M_string_length = 0;
    name_1.field_2._M_local_buf[0] = '\0';
    if ((type->element - BASE_TYPE_LONG < 2) || (type->element != BASE_TYPE_STRUCT)) {
      std::__cxx11::string::assign((char *)&name_1);
    }
    else {
      std::__cxx11::string::assign((char *)&name_1);
      if ((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) {
        GetTypeName_abi_cxx11_(&local_130,this,type->struct_def,true,false);
        std::operator+(&local_110,"(any|",&local_130);
        std::operator+(&name,&local_110,")[]");
        std::__cxx11::string::operator=((string *)&name_1,(string *)&name);
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_130);
      }
    }
    pcVar3 = "";
    if (allowNull) {
      pcVar3 = "|null";
    }
    std::operator+(__return_storage_ptr__,&name_1,pcVar3);
    this_00 = &name_1;
LAB_001c9add:
    std::__cxx11::string::~string((string *)this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeName(import_set &imports, const Definition &owner,
                          const Type &type, bool input,
                          bool allowNull = false) {
    if (!input) {
      if (IsString(type) || type.base_type == BASE_TYPE_STRUCT) {
        std::string name;
        if (IsString(type)) {
          name = "string|Uint8Array";
        } else {
          name = AddImport(imports, owner, *type.struct_def).name;
        }
        return allowNull ? (name + "|null") : name;
      }
    }

    switch (type.base_type) {
      case BASE_TYPE_BOOL: return allowNull ? "boolean|null" : "boolean";
      case BASE_TYPE_LONG:
      case BASE_TYPE_ULONG: return allowNull ? "bigint|null" : "bigint";
      case BASE_TYPE_ARRAY: {
        std::string name;
        if (type.element == BASE_TYPE_LONG || type.element == BASE_TYPE_ULONG) {
          name = "bigint[]";
        } else if (type.element != BASE_TYPE_STRUCT) {
          name = "number[]";
        } else {
          name = "any[]";
          if (parser_.opts.generate_object_based_api) {
            name = "(any|" +
                   GetTypeName(*type.struct_def, /*object_api =*/true) + ")[]";
          }
        }

        return name + (allowNull ? "|null" : "");
      }
      default:
        if (IsScalar(type.base_type)) {
          if (type.enum_def) {
            const auto enum_name =
                AddImport(imports, owner, *type.enum_def).name;
            return allowNull ? (enum_name + "|null") : enum_name;
          }
          return allowNull ? "number|null" : "number";
        }
        return "flatbuffers.Offset";
    }
  }